

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O3

Error __thiscall asmjit::RAPass::formatInlineComment(RAPass *this,StringBuilder *dst,CBNode *node)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  size_t n;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  char cVar8;
  char cVar9;
  long lVar10;
  ulong n_00;
  bool bVar11;
  
  plVar4 = (long *)node->_passData;
  if (node->_inlineComment != (char *)0x0) {
    StringBuilder::_opString(dst,1,node->_inlineComment,0xffffffffffffffff);
  }
  if ((plVar4 != (long *)0x0) && (*plVar4 != 0)) {
    uVar5 = dst->_length;
    n = this->_annotationLength - uVar5;
    if (uVar5 <= this->_annotationLength && n != 0) {
      StringBuilder::_opChars(dst,1,' ',n);
      uVar5 = dst->_length;
    }
    n_00 = (ulong)(uint)(this->_contextVd).super_ZoneVectorBase._length;
    lVar10 = uVar5 + 1;
    StringBuilder::_opChar(dst,1,'[');
    StringBuilder::_opChars(dst,1,' ',n_00);
    StringBuilder::_opChar(dst,1,']');
    if (n_00 != 0) {
      lVar6 = *plVar4;
      uVar5 = 0;
      do {
        if ((*(ulong *)(lVar6 + (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) != 0) {
          dst->_data[uVar5 + lVar10] = '.';
        }
        uVar5 = uVar5 + 1;
      } while (n_00 != uVar5);
    }
    uVar1 = *(uint *)(plVar4 + 2);
    if ((ulong)uVar1 != 0) {
      uVar2 = this->_varMapToVaListOffset;
      lVar6 = 0;
      puVar7 = (undefined8 *)0x77;
      do {
        uVar5 = (ulong)*(uint *)(*(long *)((long)plVar4 + lVar6 + (ulong)uVar2) + 0x18);
        if (dst->_length <= lVar10 + uVar5) {
          formatInlineComment();
          *puVar7 = &PTR__HostRuntime_0014d8c8;
          puVar7[1] = 0;
          puVar7[2] = 0xffffffffffffffff;
          *(undefined2 *)(puVar7 + 3) = 0;
          return 0x14d8c8;
        }
        uVar3 = *(uint *)((long)plVar4 + lVar6 + (ulong)uVar2 + 8);
        cVar8 = ((uVar3 & 0x515) == 0) * '\x03' + 'r';
        if ((uVar3 & 0x22a) != 0) {
          cVar8 = 'u';
        }
        cVar9 = cVar8;
        if ((uVar3 & 0x515) == 0) {
          cVar9 = 'w';
        }
        bVar11 = (uVar3 & 0x22a) == 0;
        if (bVar11) {
          cVar9 = cVar8;
        }
        cVar8 = 'x';
        if (bVar11) {
          cVar8 = cVar9;
        }
        if ((uVar3 & 0x515) == 0) {
          cVar8 = cVar9;
        }
        cVar9 = cVar8 + -0x20;
        if ((uVar3 >> 0xc & 1) == 0) {
          cVar9 = cVar8;
        }
        dst->_data[uVar5 + lVar10] = cVar9;
        lVar6 = lVar6 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar6);
    }
  }
  return 0;
}

Assistant:

Error RAPass::formatInlineComment(StringBuilder& dst, CBNode* node) {
#if !defined(ASMJIT_DISABLE_LOGGING)
  RAData* wd = node->getPassData<RAData>();

  if (node->hasInlineComment())
    dst.appendString(node->getInlineComment());

  if (wd && wd->liveness) {
    if (dst.getLength() < _annotationLength)
      dst.appendChars(' ', _annotationLength - dst.getLength());

    uint32_t vdCount = static_cast<uint32_t>(_contextVd.getLength());
    size_t offset = dst.getLength() + 1;

    dst.appendChar('[');
    dst.appendChars(' ', vdCount);
    dst.appendChar(']');
    RABits* liveness = wd->liveness;

    uint32_t i;
    for (i = 0; i < vdCount; i++) {
      if (liveness->getBit(i))
        dst.getData()[offset + i] = '.';
    }

    uint32_t tiedTotal = wd->tiedTotal;
    TiedReg* tiedArray = reinterpret_cast<TiedReg*>(((uint8_t*)wd) + _varMapToVaListOffset);

    for (i = 0; i < tiedTotal; i++) {
      TiedReg* tied = &tiedArray[i];
      VirtReg* vreg = tied->vreg;
      uint32_t flags = tied->flags;

      char c = 'u';
      if ( (flags & TiedReg::kRAll) && !(flags & TiedReg::kWAll)) c = 'r';
      if (!(flags & TiedReg::kRAll) &&  (flags & TiedReg::kWAll)) c = 'w';
      if ( (flags & TiedReg::kRAll) &&  (flags & TiedReg::kWAll)) c = 'x';
      // Uppercase if unused.
      if ( (flags & TiedReg::kUnuse)) c -= 'a' - 'A';

      ASMJIT_ASSERT(offset + vreg->_raId < dst.getLength());
      dst._data[offset + vreg->_raId] = c;
    }
  }
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}